

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>,_true>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
::internal_locate_impl<phmap::test_internal::MovableOnlyInstance>
          (SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>,_true>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
          *this,MovableOnlyInstance *key)

{
  bool bVar1;
  node_type *n;
  key_compare *comp;
  SearchResult<int,_true> SVar2;
  int local_38;
  MatchKind MStack_34;
  SearchResult<int,_true> res;
  iterator iter;
  MovableOnlyInstance *key_local;
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  *this_local;
  
  n = root(this);
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
  ::btree_iterator((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
                    *)&res,n,0);
  while( true ) {
    SVar2 = res;
    comp = key_comp(this);
    SVar2 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
            ::lower_bound<phmap::test_internal::MovableOnlyInstance>
                      ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                        *)SVar2,key,comp);
    local_38 = SVar2.value;
    MStack_34 = SVar2.match;
    if (MStack_34 == kEq) {
      (__return_storage_ptr__->value).node =
           (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
            *)res;
      (__return_storage_ptr__->value).position = local_38;
      __return_storage_ptr__->match = kEq;
      return __return_storage_ptr__;
    }
    bVar1 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
            ::leaf((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                    *)res);
    if (bVar1) break;
    res = (SearchResult<int,_true>)
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
          ::child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                   *)res,(long)local_38);
  }
  (__return_storage_ptr__->value).node =
       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
        *)res;
  (__return_storage_ptr__->value).position = local_38;
  __return_storage_ptr__->match = kNe;
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::internal_locate_impl(
        const K &key, std::true_type /* IsCompareTo */) const
        -> SearchResult<iterator, true> {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            SearchResult<int, true> res = iter.node->lower_bound(key, key_comp());
            iter.position = res.value;
            if (res.match == MatchKind::kEq) {
                return {iter, MatchKind::kEq};
            }
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return {iter, MatchKind::kNe};
    }